

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_UnitSystem::operator==(ON_UnitSystem *this,ON_UnitSystem *other)

{
  bool bVar1;
  ON_UnitSystem *other_local;
  ON_UnitSystem *this_local;
  
  if (this->m_unit_system != other->m_unit_system) {
    return false;
  }
  if (this->m_unit_system == CustomUnits) {
    if ((this->m_meters_per_custom_unit != other->m_meters_per_custom_unit) ||
       (NAN(this->m_meters_per_custom_unit) || NAN(other->m_meters_per_custom_unit))) {
      return false;
    }
    bVar1 = ON_wString::EqualOrdinal(&this->m_custom_unit_name,&other->m_custom_unit_name,false);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ON_UnitSystem::operator==(const ON_UnitSystem& other) const
{
  if ( m_unit_system != other.m_unit_system )
    return false;

  if ( ON::LengthUnitSystem::CustomUnits == m_unit_system )
  {
    if ( !(m_meters_per_custom_unit == other.m_meters_per_custom_unit) )
      return false;
    if ( false == m_custom_unit_name.EqualOrdinal(other.m_custom_unit_name,false) )
      return false;
  }

  return true;
}